

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

void fs_stdio_destroy_entry(ALLEGRO_FS_ENTRY *fh_)

{
  ALLEGRO_FS_ENTRY *in_RDI;
  void *unaff_retaddr;
  ALLEGRO_FS_ENTRY_STDIO *fh;
  char *in_stack_ffffffffffffffe8;
  ALLEGRO_FS_ENTRY *fp;
  
  fp = in_RDI;
  al_free_with_context
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(char *)in_RDI,in_stack_ffffffffffffffe8);
  if (in_RDI[0x15].vtable != (ALLEGRO_FS_INTERFACE *)0x0) {
    fs_stdio_close_directory(fp);
  }
  al_free_with_context
            (unaff_retaddr,(int)((ulong)fp >> 0x20),(char *)in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void fs_stdio_destroy_entry(ALLEGRO_FS_ENTRY *fh_)
{
   ALLEGRO_FS_ENTRY_STDIO *fh = (ALLEGRO_FS_ENTRY_STDIO *) fh_;

   al_free(fh->abs_path);
#ifdef ALLEGRO_WINDOWS
   al_free(fh->abs_path_utf8);
#endif

   if (fh->dir)
      fs_stdio_close_directory(fh_);

   al_free(fh);
}